

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::should_suppress_usage_tracking(CompilerGLSL *this,uint32_t id)

{
  undefined8 in_RAX;
  size_type sVar1;
  bool bVar2;
  uint32_t local_18;
  uint32_t local_14;
  
  _local_18 = CONCAT44((uint32_t)((ulong)in_RAX >> 0x20),id);
  sVar1 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->super_Compiler).forwarded_temporaries._M_h,&local_18);
  if (sVar1 == 0) {
    bVar2 = true;
  }
  else {
    _local_18 = CONCAT44(id,local_18);
    sVar1 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).suppressed_usage_tracking._M_h,&local_14);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool CompilerGLSL::should_suppress_usage_tracking(uint32_t id) const
{
	// Used only by opcodes which don't do any real "work", they just swizzle data in some fashion.
	return !expression_is_forwarded(id) || expression_suppresses_usage_tracking(id);
}